

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

int cs_impl::file_system::mkdir(char *__path,__mode_t __mode)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  lVar1 = *(long *)(__path + 8);
  if (lVar1 != 0) {
    lVar2 = *(long *)__path;
    lVar4 = 0;
    do {
      if (*(char *)(lVar2 + lVar4) == '\\') {
        *(undefined1 *)(lVar2 + lVar4) = 0x2f;
      }
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  iVar3 = ::mkdir(*(char **)__path,0x1ed);
  return CONCAT31((int3)((uint)iVar3 >> 8),iVar3 == 0);
}

Assistant:

bool mkdir(std::string path)
		{
			for (auto &ch: path) {
				if (ch == path_separator_reversed)
					ch = cs::path_separator;
			}
			return cs_system_impl::mkdir_impl(path, 0755);
		}